

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O1

string * __thiscall CodeGen::unionName_abi_cxx11_(string *__return_storage_ptr__,CodeGen *this)

{
  pointer pcVar1;
  long lVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_type *psVar5;
  char *pcVar6;
  char *tmp_finish;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  string s;
  char **local_100;
  long local_f8;
  char *local_f0 [2];
  long *local_e0;
  undefined8 local_d8;
  long local_d0;
  undefined8 uStack_c8;
  undefined1 *local_c0;
  char *local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  string local_a0;
  undefined8 local_80;
  long local_70 [3];
  char local_56 [6];
  char *local_50;
  char *local_48;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char> local_40;
  
  pcVar1 = (this->schemaFile_)._M_dataplus._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + (this->schemaFile_)._M_string_length);
  lVar2 = std::__cxx11::string::find_last_of((char *)&local_a0,0x176314,0xffffffffffffffff);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_a0);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_80);
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
  }
  makeCanonical(&local_a0,false);
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,local_a0._M_dataplus._M_p,
             local_a0._M_dataplus._M_p + local_a0._M_string_length);
  std::__cxx11::string::append((char *)&local_100);
  local_40.m_value = this->unionNumber_;
  this->unionNumber_ = local_40.m_value + 1;
  local_b8 = (char *)0x0;
  local_b0 = 0;
  local_50 = (char *)((long)&local_80 + 2);
  local_40.m_czero = '0';
  local_40.m_zero = 0x30;
  local_c0 = &local_b0;
  local_48 = local_56;
  local_40.m_finish = local_56;
  local_50 = boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char>::convert
                       (&local_40);
  local_48 = local_56;
  std::__cxx11::string::replace((ulong)&local_c0,0,local_b8,(ulong)local_50);
  pcVar6 = &DAT_0000000f;
  if (local_100 != local_f0) {
    pcVar6 = local_f0[0];
  }
  if (pcVar6 < local_b8 + local_f8) {
    pcVar6 = &DAT_0000000f;
    if (local_c0 != &local_b0) {
      pcVar6 = (char *)CONCAT71(uStack_af,local_b0);
    }
    if (local_b8 + local_f8 <= pcVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_100);
      goto LAB_001479b2;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_c0);
LAB_001479b2:
  local_e0 = &local_d0;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_d0 = *plVar4;
    uStack_c8 = puVar3[3];
  }
  else {
    local_d0 = *plVar4;
    local_e0 = (long *)*puVar3;
  }
  local_d8 = puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_e0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,(ulong)(local_f0[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string CodeGen::unionName()
{
    string s = schemaFile_;
    string::size_type n = s.find_last_of("/\\");
    if (n != string::npos) {
        s = s.substr(n);
    }
    makeCanonical(s, false);

    return s + "_Union__" + boost::lexical_cast<string>(unionNumber_++) + "__";
}